

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O1

void Omega_h::write_reals_txt(ostream *stream,Reals *a,Int ncomps)

{
  int *piVar1;
  Alloc *pAVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  HostRead<double> h_a;
  char local_69;
  ulong local_68;
  Read<signed_char> local_60;
  long local_50;
  ulong local_48;
  HostRead<double> local_40;
  
  local_68 = CONCAT44(in_register_00000014,ncomps);
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar8 = pAVar2->size;
  }
  else {
    sVar8 = (ulong)pAVar2 >> 3;
  }
  uVar5 = divide_no_remainder<int>((int)(sVar8 >> 3),ncomps);
  local_60.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  HostRead<double>::HostRead(&local_40,&local_60);
  pAVar2 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  lVar9 = *(long *)stream;
  lVar3 = *(long *)(lVar9 + -0x18);
  *(uint *)(stream + lVar3 + 0x18) = *(uint *)(stream + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(stream + *(long *)(lVar9 + -0x18) + 8) = 0x11;
  if (0 < (int)uVar5) {
    iVar4 = (int)local_68;
    local_48 = (ulong)uVar5;
    uVar7 = local_68 & 0xffffffff;
    local_50 = uVar7 * 8;
    lVar9 = 0;
    uVar6 = 0;
    do {
      if (0 < (int)local_68) {
        uVar10 = 0;
        do {
          std::ostream::_M_insert<double>
                    (*(double *)
                      ((long)local_40.read_.write_.shared_alloc_.direct_ptr + uVar10 * 8 + lVar9));
          if ((long)uVar10 < (long)(iVar4 + -1)) {
            local_69 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(stream,&local_69,1);
          }
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
      local_69 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(stream,&local_69,1);
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + local_50;
    } while (uVar6 != local_48);
  }
  if (((ulong)local_40.read_.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.read_.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.read_.write_.shared_alloc_.alloc);
      operator_delete(local_40.read_.write_.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void write_reals_txt(std::ostream& stream, Reals a, Int ncomps) {
  auto n = divide_no_remainder(a.size(), ncomps);
  auto h_a = HostRead<Real>(a);
  stream << std::scientific << std::setprecision(17);
  for (LO i = 0; i < n; ++i) {
    for (Int j = 0; j < ncomps; ++j) {
      stream << h_a[i * ncomps + j];
      if (j < ncomps - 1) stream << ' ';
    }
    stream << '\n';
  }
}